

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_from_pubkey
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *xonly_pubkey,int *pk_parity,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  bool bVar2;
  secp256k1_ge pk;
  secp256k1_ge sStack_68;
  
  if (xonly_pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_xonly_pubkey_from_pubkey_cold_2();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_xonly_pubkey_from_pubkey_cold_1();
  }
  else {
    iVar1 = secp256k1_pubkey_load(ctx,&sStack_68,pubkey);
    if (iVar1 != 0) {
      bVar2 = (sStack_68.y.n[0] & 1) != 0;
      if (bVar2) {
        sStack_68.y.n[0] = 0x3ffffbfffff0bc - sStack_68.y.n[0];
        sStack_68.y.n[1] = 0x3ffffffffffffc - sStack_68.y.n[1];
        sStack_68.y.n[2] = 0x3ffffffffffffc - sStack_68.y.n[2];
        sStack_68.y.n[3] = 0x3ffffffffffffc - sStack_68.y.n[3];
        sStack_68.y.n[4] = 0x3fffffffffffc - sStack_68.y.n[4];
      }
      if (pk_parity != (int *)0x0) {
        *pk_parity = (uint)bVar2;
      }
      secp256k1_pubkey_save((secp256k1_pubkey *)xonly_pubkey,&sStack_68);
      return 1;
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_from_pubkey(const secp256k1_context* ctx, secp256k1_xonly_pubkey *xonly_pubkey, int *pk_parity, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(xonly_pubkey != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(xonly_pubkey, &pk);
    return 1;
}